

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O1

void __thiscall
amrex::MLEBTensorOp::compVelGrad
          (MLEBTensorOp *this,int amrlev,Array<MultiFab_*,_3> *fluxes,MultiFab *sol,Location loc)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  FabType FVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  FabArray<amrex::EBCellFlagFab> *pFVar38;
  int *piVar39;
  DataAllocator DVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  BaseFab<double> *this_00;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  Real dzi;
  Real dyi;
  Real dxi;
  Array4<const_double> vfab;
  MFItInfo mfi_info;
  Box zbx;
  Box ybx;
  Box xbx;
  Array<FArrayBox,_3> fluxfab_tmp;
  MFIter mfi;
  Array4<double> dst;
  Elixir fzeli;
  Elixir fyeli;
  Elixir fxeli;
  long local_550;
  long local_538;
  long local_530;
  long local_528;
  long local_520;
  long local_518;
  long local_510;
  long local_508;
  long local_4f8;
  long local_4f0;
  long local_4e8;
  long local_4e0;
  long local_4d8;
  long local_4d0;
  long local_4c8;
  long local_4c0;
  long local_4b8;
  long local_4b0;
  long local_4a8;
  long local_4a0;
  long local_498;
  long local_488;
  long local_480;
  long local_468;
  long local_458;
  long local_450;
  long local_408;
  Array4<const_double> local_328;
  MFItInfo local_2e4;
  Box local_2d0;
  Box local_2b4;
  double local_298;
  double local_290;
  double local_288;
  FabArray<amrex::EBCellFlagFab> *local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  double *local_258;
  Array<MultiFab_*,_3> *local_250;
  Box local_248;
  Box local_22c;
  BaseFab<double> local_210;
  FArrayBox local_1c8;
  FArrayBox local_180;
  MFIter local_138;
  Array4<double> local_d8;
  Elixir local_98;
  Elixir local_80;
  Elixir local_68;
  Box local_4c;
  
  local_250 = fluxes;
  if (FaceCentroid < loc) {
    Abort_host("MLEBTensorOp::compVelGrad() unknown location for VelGradients.");
  }
  lVar37 = 0;
  applyBCTensor(this,amrlev,0,sol,Inhomogeneous,Solution,
                (MLMGBndry *)
                (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.m_bndry_sol.
                super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
                super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>);
  lVar50 = **(long **)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp
                       .m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if (lVar50 != 0) {
    lVar37 = __dynamic_cast(lVar50,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar37 == 0) {
    pFVar38 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    pFVar38 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar37 + 0xd8));
  }
  lVar50 = *(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                     m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  dVar3 = *(double *)(lVar50 + 0x38);
  dVar4 = *(double *)(lVar50 + 0x40);
  dVar5 = *(double *)(lVar50 + 0x48);
  local_2e4.num_streams = Gpu::Device::max_gpu_streams;
  local_2e4.do_tiling = true;
  local_2e4.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_2e4.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_2e4.tilesize.vect[2] = DAT_00753ec0;
  local_2e4.dynamic = true;
  local_2e4.device_sync = true;
  lVar50 = 0;
  do {
    FArrayBox::FArrayBox((FArrayBox *)((long)(&local_210.domain.smallend + -2) + lVar50));
    lVar50 = lVar50 + 0x48;
  } while (lVar50 != 0xd8);
  MFIter::MFIter(&local_138,(FabArrayBase *)sol,&local_2e4);
  if (local_138.currentIndex < local_138.endIndex) {
    local_290 = dVar4 * 0.25;
    local_298 = dVar5 * 0.25;
    local_288 = dVar3 * 0.25;
    local_280 = pFVar38;
    do {
      MFIter::tilebox(&local_4c,&local_138);
      FVar34 = regular;
      if (pFVar38 != (FabArray<amrex::EBCellFlagFab> *)0x0) {
        piVar39 = &local_138.currentIndex;
        if (local_138.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar39 = ((local_138.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_138.currentIndex;
        }
        FVar34 = EBCellFlagFab::getType
                           ((pFVar38->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar39],&local_4c);
      }
      if (FVar34 != covered) {
        if (FVar34 == regular) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_328,&sol->super_FabArray<amrex::FArrayBox>,&local_138);
          MFIter::nodaltilebox(&local_22c,&local_138,0);
          MFIter::nodaltilebox(&local_2b4,&local_138,1);
          MFIter::nodaltilebox(&local_2d0,&local_138,2);
          FArrayBox::resize((FArrayBox *)&local_210,&local_22c,9,(Arena *)0x0);
          FArrayBox::resize(&local_1c8,&local_2b4,9,(Arena *)0x0);
          FArrayBox::resize(&local_180,&local_2d0,9,(Arena *)0x0);
          DVar40.m_arena = local_210.super_DataAllocator.m_arena;
          if (local_210.super_DataAllocator.m_arena == (Arena *)0x0) {
            DVar40.m_arena = The_Arena();
          }
          Gpu::Elixir::Elixir(&local_68,(void *)0x0,DVar40.m_arena);
          DVar40.m_arena = local_1c8.super_BaseFab<double>.super_DataAllocator.m_arena;
          if (local_1c8.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
            DVar40.m_arena = The_Arena();
          }
          Gpu::Elixir::Elixir(&local_80,(void *)0x0,DVar40.m_arena);
          DVar40.m_arena = local_180.super_BaseFab<double>.super_DataAllocator.m_arena;
          if (local_180.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
            DVar40.m_arena = The_Arena();
          }
          Gpu::Elixir::Elixir(&local_98,(void *)0x0,DVar40.m_arena);
          lVar50 = (long)local_1c8.super_BaseFab<double>.domain.smallend.vect[0];
          lVar37 = (long)local_1c8.super_BaseFab<double>.domain.smallend.vect[1];
          local_278 = (long)local_1c8.super_BaseFab<double>.domain.smallend.vect[2];
          local_258 = local_180.super_BaseFab<double>.dptr;
          local_260 = (long)local_180.super_BaseFab<double>.domain.smallend.vect[0];
          local_268 = (long)local_180.super_BaseFab<double>.domain.smallend.vect[1];
          local_270 = (long)local_180.super_BaseFab<double>.domain.smallend.vect[2];
          local_4f0 = (long)local_22c.smallend.vect[2];
          if (local_22c.smallend.vect[2] <= local_22c.bigend.vect[2]) {
            lVar44 = (long)local_210.domain.smallend.vect[0];
            lVar54 = (long)local_210.domain.smallend.vect[1];
            lVar59 = (long)local_210.domain.smallend.vect[2];
            lVar45 = (long)((local_210.domain.bigend.vect[1] - local_210.domain.smallend.vect[1]) +
                           1);
            lVar62 = (long)((local_210.domain.bigend.vect[2] - local_210.domain.smallend.vect[2]) +
                           1);
            lVar52 = (long)local_22c.smallend.vect[1];
            lVar60 = (long)((local_210.domain.bigend.vect[0] - local_210.domain.smallend.vect[0]) +
                           1);
            lVar55 = (long)local_22c.smallend.vect[0];
            local_498 = (lVar52 * 8 + (local_4f0 - lVar59) * lVar45 * 8 + lVar54 * -8) * lVar60 +
                        lVar55 * 8 + lVar44 * -8 + (long)local_210.dptr;
            lVar46 = lVar45 * lVar60 * 8;
            lVar48 = lVar60 * 8;
            local_528 = ((lVar62 * 8 + local_4f0 * 8 + lVar59 * -8) * lVar45 + lVar52 * 8 +
                        lVar54 * -8) * lVar60 + lVar55 * 8 + lVar44 * -8 + (long)local_210.dptr;
            local_4f8 = ((lVar62 * 0x10 + local_4f0 * 8 + lVar59 * -8) * lVar45 + lVar52 * 8 +
                        lVar54 * -8) * lVar60 + lVar55 * 8 + lVar44 * -8 + (long)local_210.dptr;
            local_4a0 = ((local_4f0 * 8 + lVar62 * 0x18 + lVar59 * -8) * lVar45 + lVar52 * 8 +
                        lVar54 * -8) * lVar60 + lVar55 * 8 + lVar44 * -8 + (long)local_210.dptr;
            local_4a8 = ((lVar62 * 0x20 + local_4f0 * 8 + lVar59 * -8) * lVar45 + lVar52 * 8 +
                        lVar54 * -8) * lVar60 + lVar55 * 8 + lVar44 * -8 + (long)local_210.dptr;
            local_4b0 = ((local_4f0 * 8 + lVar62 * 0x28 + lVar59 * -8) * lVar45 + lVar52 * 8 +
                        lVar54 * -8) * lVar60 + lVar55 * 8 + lVar44 * -8 + (long)local_210.dptr;
            local_4b8 = ((lVar62 * 0x30 + local_4f0 * 8 + lVar59 * -8) * lVar45 + lVar52 * 8 +
                        lVar54 * -8) * lVar60 + lVar55 * 8 + lVar44 * -8 + (long)local_210.dptr;
            local_4c0 = ((lVar62 * 0x38 + local_4f0 * 8 + lVar59 * -8) * lVar45 + lVar52 * 8 +
                        lVar54 * -8) * lVar60 + lVar55 * 8 + lVar44 * -8 + (long)local_210.dptr;
            local_4c8 = ((lVar62 * 0x40 + local_4f0 * 8 + lVar59 * -8) * lVar45 + lVar52 * 8 +
                        lVar54 * -8) * lVar60 + lVar55 * 8 + lVar44 * -8 + (long)local_210.dptr;
            iVar42 = local_22c.smallend.vect[2] + -1;
            iVar43 = local_22c.smallend.vect[2];
            do {
              iVar43 = iVar43 + 1;
              if (local_22c.smallend.vect[1] <= local_22c.bigend.vect[1]) {
                lVar60 = (long)local_328.begin.x;
                lVar56 = local_328.kstride * (local_4f0 - local_328.begin.z);
                lVar44 = local_328.jstride * 8;
                lVar59 = (lVar52 - local_328.begin.y) * lVar44;
                lVar45 = local_328.kstride * 8;
                lVar62 = (iVar42 - local_328.begin.z) * lVar45 + lVar59;
                lVar61 = local_328.nstride * 0x10;
                lVar65 = lVar45 * (local_4f0 - local_328.begin.z);
                lVar54 = (iVar43 - local_328.begin.z) * lVar45 + lVar59;
                lVar59 = lVar59 + lVar65;
                lVar68 = (long)local_328.p + lVar61 + lVar62 + lVar60 * -8 + lVar55 * 8;
                lVar45 = (long)local_328.p +
                         local_328.nstride * 8 + lVar62 + lVar60 * -8 + lVar55 * 8;
                lVar53 = (long)local_328.p + lVar62 + lVar60 * -8 + lVar55 * 8;
                lVar63 = (long)local_328.p + lVar54 + lVar61 + lVar60 * -8 + lVar55 * 8;
                lVar57 = (long)local_328.p +
                         lVar54 + local_328.nstride * 8 + lVar60 * -8 + lVar55 * 8;
                lVar58 = (long)local_328.p + lVar54 + lVar60 * -8 + lVar55 * 8;
                local_468 = (long)local_328.p + lVar61 + lVar59 + lVar60 * -8 + lVar55 * 8;
                local_508 = (long)local_328.p +
                            lVar59 + local_328.nstride * 8 + lVar60 * -8 + lVar55 * 8;
                lVar51 = (long)local_328.p + lVar59 + lVar60 * -8 + lVar55 * 8;
                lVar54 = lVar65 + lVar60 * -8 + lVar55 * 8;
                lVar59 = lVar65 + local_328.nstride * 8 + lVar60 * -8 + lVar55 * 8;
                lVar60 = lVar65 + lVar61 + lVar60 * -8 + lVar55 * 8;
                iVar35 = (local_22c.smallend.vect[1] + 1) - local_328.begin.y;
                iVar36 = (local_22c.smallend.vect[1] + -1) - local_328.begin.y;
                local_408 = local_4b8;
                local_458 = local_4b0;
                local_450 = local_4a8;
                local_518 = local_4a0;
                local_510 = local_4f8;
                local_4e8 = local_498;
                lVar62 = local_4c8;
                lVar61 = local_4c0;
                lVar65 = local_528;
                local_520 = lVar52;
                do {
                  if (local_22c.smallend.vect[0] <= local_22c.bigend.vect[0]) {
                    lVar66 = iVar35 * lVar44;
                    lVar67 = iVar36 * lVar44;
                    lVar41 = (local_520 - local_328.begin.y) * local_328.jstride;
                    lVar47 = 0;
                    do {
                      lVar69 = (long)(((local_22c.smallend.vect[0] + -1) - local_328.begin.x) +
                                     (int)lVar47);
                      pdVar1 = local_328.p + lVar41 + lVar69 + lVar56;
                      dVar6 = *(double *)(local_508 + lVar47 * 8);
                      dVar7 = pdVar1[local_328.nstride];
                      dVar8 = *(double *)(local_468 + lVar47 * 8);
                      dVar9 = pdVar1[local_328.nstride * 2];
                      dVar10 = *(double *)((long)local_328.p + lVar47 * 8 + lVar66 + lVar54);
                      pdVar2 = local_328.p +
                               (((int)local_520 - local_328.begin.y) + 1) * local_328.jstride +
                               lVar56 + lVar69;
                      dVar11 = *pdVar2;
                      dVar12 = *(double *)((long)local_328.p + lVar47 * 8 + lVar66 + lVar59);
                      dVar13 = pdVar2[local_328.nstride];
                      dVar14 = *(double *)((long)local_328.p + lVar47 * 8 + lVar66 + lVar60);
                      dVar15 = pdVar2[local_328.nstride * 2];
                      dVar16 = *(double *)((long)local_328.p + lVar47 * 8 + lVar67 + lVar54);
                      pdVar2 = local_328.p +
                               ((int)local_520 + ~local_328.begin.y) * local_328.jstride +
                               lVar56 + lVar69;
                      dVar17 = *pdVar2;
                      dVar18 = *(double *)((long)local_328.p + lVar47 * 8 + lVar67 + lVar59);
                      dVar19 = pdVar2[local_328.nstride];
                      dVar20 = *(double *)((long)local_328.p + lVar47 * 8 + lVar67 + lVar60);
                      dVar21 = pdVar2[local_328.nstride * 2];
                      dVar22 = *(double *)(lVar58 + lVar47 * 8);
                      pdVar2 = local_328.p +
                               lVar41 + lVar69 + (((int)local_4f0 - local_328.begin.z) + 1) *
                                                 local_328.kstride;
                      dVar23 = *pdVar2;
                      dVar24 = *(double *)(lVar57 + lVar47 * 8);
                      dVar25 = pdVar2[local_328.nstride];
                      dVar26 = *(double *)(lVar63 + lVar47 * 8);
                      dVar27 = pdVar2[local_328.nstride * 2];
                      dVar28 = *(double *)(lVar53 + lVar47 * 8);
                      pdVar2 = local_328.p +
                               lVar41 + lVar69 + (~local_328.begin.z + (int)local_4f0) *
                                                 local_328.kstride;
                      dVar29 = *pdVar2;
                      dVar30 = *(double *)(lVar45 + lVar47 * 8);
                      dVar31 = pdVar2[local_328.nstride];
                      dVar32 = *(double *)(lVar68 + lVar47 * 8);
                      dVar33 = pdVar2[local_328.nstride * 2];
                      *(double *)(local_4e8 + lVar47 * 8) =
                           (*(double *)(lVar51 + lVar47 * 8) - *pdVar1) * dVar3;
                      *(double *)(lVar65 + lVar47 * 8) = (dVar6 - dVar7) * dVar3;
                      *(double *)(local_510 + lVar47 * 8) = (dVar8 - dVar9) * dVar3;
                      *(double *)(local_518 + lVar47 * 8) =
                           (((dVar10 + dVar11) - dVar16) - dVar17) * local_290;
                      *(double *)(local_450 + lVar47 * 8) =
                           (((dVar12 + dVar13) - dVar18) - dVar19) * local_290;
                      *(double *)(local_458 + lVar47 * 8) =
                           (((dVar14 + dVar15) - dVar20) - dVar21) * local_290;
                      *(double *)(local_408 + lVar47 * 8) =
                           (((dVar22 + dVar23) - dVar28) - dVar29) * local_298;
                      *(double *)(lVar61 + lVar47 * 8) =
                           (((dVar24 + dVar25) - dVar30) - dVar31) * local_298;
                      *(double *)(lVar62 + lVar47 * 8) =
                           (((dVar26 + dVar27) - dVar32) - dVar33) * local_298;
                      lVar47 = lVar47 + 1;
                    } while ((local_22c.bigend.vect[0] - local_22c.smallend.vect[0]) + 1 !=
                             (int)lVar47);
                  }
                  local_520 = local_520 + 1;
                  lVar68 = lVar68 + lVar44;
                  lVar45 = lVar45 + lVar44;
                  lVar53 = lVar53 + lVar44;
                  lVar63 = lVar63 + lVar44;
                  lVar57 = lVar57 + lVar44;
                  lVar58 = lVar58 + lVar44;
                  local_468 = local_468 + lVar44;
                  local_508 = local_508 + lVar44;
                  lVar51 = lVar51 + lVar44;
                  iVar35 = iVar35 + 1;
                  iVar36 = iVar36 + 1;
                  local_4e8 = local_4e8 + lVar48;
                  lVar65 = lVar65 + lVar48;
                  local_510 = local_510 + lVar48;
                  local_518 = local_518 + lVar48;
                  local_450 = local_450 + lVar48;
                  local_458 = local_458 + lVar48;
                  local_408 = local_408 + lVar48;
                  lVar61 = lVar61 + lVar48;
                  lVar62 = lVar62 + lVar48;
                } while (local_22c.bigend.vect[1] + 1 != (int)local_520);
              }
              local_4f0 = local_4f0 + 1;
              iVar42 = iVar42 + 1;
              local_498 = local_498 + lVar46;
              local_528 = local_528 + lVar46;
              local_4f8 = local_4f8 + lVar46;
              local_4a0 = local_4a0 + lVar46;
              local_4a8 = local_4a8 + lVar46;
              local_4b0 = local_4b0 + lVar46;
              local_4b8 = local_4b8 + lVar46;
              local_4c0 = local_4c0 + lVar46;
              local_4c8 = local_4c8 + lVar46;
            } while (local_22c.bigend.vect[2] + 1 != (int)local_4f0);
          }
          local_528 = (long)local_2b4.smallend.vect[2];
          if (local_2b4.smallend.vect[2] <= local_2b4.bigend.vect[2]) {
            lVar44 = (long)((local_1c8.super_BaseFab<double>.domain.bigend.vect[1] -
                            local_1c8.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
            lVar46 = (long)((local_1c8.super_BaseFab<double>.domain.bigend.vect[2] -
                            local_1c8.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
            lVar54 = (long)local_2b4.smallend.vect[1];
            lVar52 = (long)((local_1c8.super_BaseFab<double>.domain.bigend.vect[0] -
                            local_1c8.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
            lVar55 = (long)local_2b4.smallend.vect[0];
            local_4a0 = (lVar54 * 8 + (local_528 - local_278) * lVar44 * 8 + lVar37 * -8) * lVar52 +
                        lVar55 * 8 + lVar50 * -8 + (long)local_1c8.super_BaseFab<double>.dptr;
            lVar45 = lVar44 * lVar52 * 8;
            lVar48 = lVar52 * 8;
            local_4a8 = ((lVar46 * 8 + local_528 * 8 + local_278 * -8) * lVar44 + lVar54 * 8 +
                        lVar37 * -8) * lVar52 + lVar55 * 8 + lVar50 * -8 +
                        (long)local_1c8.super_BaseFab<double>.dptr;
            local_4b0 = ((lVar46 * 0x10 + local_528 * 8 + local_278 * -8) * lVar44 + lVar54 * 8 +
                        lVar37 * -8) * lVar52 + lVar55 * 8 + lVar50 * -8 +
                        (long)local_1c8.super_BaseFab<double>.dptr;
            local_4b8 = ((local_528 * 8 + lVar46 * 0x18 + local_278 * -8) * lVar44 + lVar54 * 8 +
                        lVar37 * -8) * lVar52 + lVar55 * 8 + lVar50 * -8 +
                        (long)local_1c8.super_BaseFab<double>.dptr;
            local_4c0 = ((lVar46 * 0x20 + local_528 * 8 + local_278 * -8) * lVar44 + lVar54 * 8 +
                        lVar37 * -8) * lVar52 + lVar55 * 8 + lVar50 * -8 +
                        (long)local_1c8.super_BaseFab<double>.dptr;
            local_4c8 = ((local_528 * 8 + lVar46 * 0x28 + local_278 * -8) * lVar44 + lVar54 * 8 +
                        lVar37 * -8) * lVar52 + lVar55 * 8 + lVar50 * -8 +
                        (long)local_1c8.super_BaseFab<double>.dptr;
            local_4d0 = ((lVar46 * 0x30 + local_528 * 8 + local_278 * -8) * lVar44 + lVar54 * 8 +
                        lVar37 * -8) * lVar52 + lVar55 * 8 + lVar50 * -8 +
                        (long)local_1c8.super_BaseFab<double>.dptr;
            local_4d8 = ((lVar46 * 0x38 + local_528 * 8 + local_278 * -8) * lVar44 + lVar54 * 8 +
                        lVar37 * -8) * lVar52 + lVar55 * 8 + lVar50 * -8 +
                        (long)local_1c8.super_BaseFab<double>.dptr;
            local_4e0 = ((lVar46 * 0x40 + local_528 * 8 + local_278 * -8) * lVar44 + lVar54 * 8 +
                        lVar37 * -8) * lVar52 + lVar55 * 8 + lVar50 * -8 +
                        (long)local_1c8.super_BaseFab<double>.dptr;
            iVar42 = local_2b4.smallend.vect[2] + -1;
            iVar43 = local_2b4.smallend.vect[2];
            do {
              iVar43 = iVar43 + 1;
              if (local_2b4.smallend.vect[1] <= local_2b4.bigend.vect[1]) {
                lVar61 = (long)local_328.begin.x;
                lVar57 = local_328.kstride * (local_528 - local_328.begin.z);
                lVar44 = local_328.jstride * 8;
                lVar52 = (lVar54 - local_328.begin.y) * lVar44;
                lVar41 = local_328.kstride * 8;
                lVar51 = (iVar42 - local_328.begin.z) * lVar41;
                lVar50 = lVar52 + lVar51;
                lVar53 = local_328.nstride * 0x10;
                lVar62 = (iVar43 - local_328.begin.z) * lVar41;
                lVar41 = lVar41 * (local_528 - local_328.begin.z);
                lVar37 = lVar52 + lVar62;
                lVar52 = lVar52 + lVar41;
                lVar56 = (long)local_328.p + lVar50 + lVar53 + lVar61 * -8 + lVar55 * 8;
                lVar46 = (long)local_328.p +
                         lVar50 + local_328.nstride * 8 + lVar61 * -8 + lVar55 * 8;
                lVar58 = (long)local_328.p + lVar50 + lVar61 * -8 + lVar55 * 8;
                local_530 = (long)local_328.p + lVar37 + lVar53 + lVar61 * -8 + lVar55 * 8;
                local_508 = (long)local_328.p +
                            lVar37 + local_328.nstride * 8 + lVar61 * -8 + lVar55 * 8;
                local_510 = (long)local_328.p + lVar37 + lVar61 * -8 + lVar55 * 8;
                lVar63 = (long)local_328.p + lVar52 + lVar53 + lVar61 * -8 + lVar55 * 8 + 8;
                lVar68 = (long)local_328.p +
                         lVar52 + local_328.nstride * 8 + lVar61 * -8 + lVar55 * 8 + 8;
                lVar65 = (long)local_328.p + lVar52 + lVar61 * -8 + lVar55 * 8 + 8;
                iVar35 = (local_2b4.smallend.vect[1] + -1) - local_328.begin.y;
                local_458 = local_4c0;
                local_450 = local_4b8;
                local_4e8 = local_4b0;
                local_518 = local_4a8;
                lVar50 = local_4e0;
                lVar37 = local_4d8;
                lVar52 = local_4a0;
                lVar59 = local_4c8;
                lVar60 = local_4d0;
                local_480 = lVar54;
                do {
                  if (local_2b4.smallend.vect[0] <= local_2b4.bigend.vect[0]) {
                    lVar64 = iVar35 * lVar44;
                    lVar47 = lVar64 + lVar53 + lVar41 + lVar61 * -8 + lVar55 * 8;
                    lVar66 = lVar64 + lVar41 + local_328.nstride * 8 + lVar61 * -8 + lVar55 * 8;
                    lVar67 = lVar64 + lVar41 + lVar61 * -8 + lVar55 * 8;
                    lVar69 = 0;
                    do {
                      lVar70 = (long)(((local_2b4.smallend.vect[0] + -1) - local_328.begin.x) +
                                     (int)lVar69);
                      pdVar1 = local_328.p +
                               (local_480 - local_328.begin.y) * local_328.jstride + lVar57 + lVar70
                      ;
                      dVar6 = *(double *)(lVar68 + lVar69 * 8);
                      dVar7 = *(double *)((long)local_328.p + lVar69 * 8 + lVar66 + 8);
                      dVar8 = pdVar1[local_328.nstride];
                      dVar9 = *(double *)(lVar63 + lVar69 * 8);
                      dVar10 = *(double *)((long)local_328.p + lVar69 * 8 + lVar47 + 8);
                      dVar11 = pdVar1[local_328.nstride * 2];
                      pdVar2 = local_328.p +
                               (~local_328.begin.y + (int)local_480) * local_328.jstride +
                               lVar57 + lVar70;
                      dVar12 = pdVar2[local_328.nstride];
                      dVar13 = pdVar2[local_328.nstride * 2];
                      dVar14 = *(double *)(lVar65 + -8 + lVar69 * 8);
                      dVar15 = *(double *)(lVar68 + -8 + lVar69 * 8);
                      dVar16 = *(double *)(lVar63 + -8 + lVar69 * 8);
                      dVar17 = *(double *)((long)local_328.p + lVar69 * 8 + lVar67);
                      dVar18 = *(double *)((long)local_328.p + lVar69 * 8 + lVar66);
                      dVar19 = *(double *)((long)local_328.p + lVar69 * 8 + lVar47);
                      dVar20 = *(double *)(local_510 + lVar69 * 8);
                      dVar21 = *(double *)
                                ((long)local_328.p +
                                lVar69 * 8 + lVar64 + lVar62 + lVar61 * -8 + lVar55 * 8);
                      dVar22 = *(double *)(lVar58 + lVar69 * 8);
                      dVar23 = *(double *)
                                ((long)local_328.p +
                                lVar69 * 8 + lVar64 + lVar51 + lVar61 * -8 + lVar55 * 8);
                      dVar24 = *(double *)(local_508 + lVar69 * 8);
                      dVar25 = *(double *)
                                ((long)local_328.p +
                                lVar69 * 8 +
                                lVar64 + lVar62 + local_328.nstride * 8 + lVar61 * -8 + lVar55 * 8);
                      dVar26 = *(double *)(lVar46 + lVar69 * 8);
                      dVar27 = *(double *)
                                ((long)local_328.p +
                                lVar69 * 8 +
                                lVar64 + lVar51 + local_328.nstride * 8 + lVar61 * -8 + lVar55 * 8);
                      dVar28 = *(double *)(local_530 + lVar69 * 8);
                      dVar29 = *(double *)
                                ((long)local_328.p +
                                lVar69 * 8 + lVar64 + lVar62 + lVar53 + lVar61 * -8 + lVar55 * 8);
                      dVar30 = *(double *)(lVar56 + lVar69 * 8);
                      dVar31 = *(double *)
                                ((long)local_328.p +
                                lVar69 * 8 + lVar64 + lVar51 + lVar53 + lVar61 * -8 + lVar55 * 8);
                      *(double *)(lVar52 + lVar69 * 8) =
                           (((*(double *)(lVar65 + lVar69 * 8) +
                             *(double *)((long)local_328.p + lVar69 * 8 + lVar67 + 8)) - *pdVar1) -
                           *pdVar2) * local_288;
                      *(double *)(local_518 + lVar69 * 8) =
                           (((dVar6 + dVar7) - dVar8) - dVar12) * local_288;
                      *(double *)(local_4e8 + lVar69 * 8) =
                           (((dVar9 + dVar10) - dVar11) - dVar13) * local_288;
                      *(double *)(local_450 + lVar69 * 8) = (dVar14 - dVar17) * dVar4;
                      *(double *)(local_458 + lVar69 * 8) = (dVar15 - dVar18) * dVar4;
                      *(double *)(lVar59 + lVar69 * 8) = (dVar16 - dVar19) * dVar4;
                      *(double *)(lVar60 + lVar69 * 8) =
                           (((dVar20 + dVar21) - dVar22) - dVar23) * local_298;
                      *(double *)(lVar37 + lVar69 * 8) =
                           (((dVar24 + dVar25) - dVar26) - dVar27) * local_298;
                      *(double *)(lVar50 + lVar69 * 8) =
                           (((dVar28 + dVar29) - dVar30) - dVar31) * local_298;
                      lVar69 = lVar69 + 1;
                    } while ((local_2b4.bigend.vect[0] - local_2b4.smallend.vect[0]) + 1 !=
                             (int)lVar69);
                  }
                  local_480 = local_480 + 1;
                  lVar56 = lVar56 + lVar44;
                  lVar46 = lVar46 + lVar44;
                  lVar58 = lVar58 + lVar44;
                  local_530 = local_530 + lVar44;
                  local_508 = local_508 + lVar44;
                  local_510 = local_510 + lVar44;
                  lVar63 = lVar63 + lVar44;
                  lVar68 = lVar68 + lVar44;
                  lVar65 = lVar65 + lVar44;
                  iVar35 = iVar35 + 1;
                  lVar52 = lVar52 + lVar48;
                  local_518 = local_518 + lVar48;
                  local_4e8 = local_4e8 + lVar48;
                  local_450 = local_450 + lVar48;
                  local_458 = local_458 + lVar48;
                  lVar59 = lVar59 + lVar48;
                  lVar60 = lVar60 + lVar48;
                  lVar37 = lVar37 + lVar48;
                  lVar50 = lVar50 + lVar48;
                } while (local_2b4.bigend.vect[1] + 1 != (int)local_480);
              }
              local_528 = local_528 + 1;
              iVar42 = iVar42 + 1;
              local_4a0 = local_4a0 + lVar45;
              local_4a8 = local_4a8 + lVar45;
              local_4b0 = local_4b0 + lVar45;
              local_4b8 = local_4b8 + lVar45;
              local_4c0 = local_4c0 + lVar45;
              local_4c8 = local_4c8 + lVar45;
              local_4d0 = local_4d0 + lVar45;
              local_4d8 = local_4d8 + lVar45;
              local_4e0 = local_4e0 + lVar45;
            } while (local_2b4.bigend.vect[2] + 1 != (int)local_528);
          }
          local_538 = (long)local_2d0.smallend.vect[2];
          if (local_2d0.smallend.vect[2] <= local_2d0.bigend.vect[2]) {
            lVar46 = (long)((local_180.super_BaseFab<double>.domain.bigend.vect[1] -
                            local_180.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
            lVar37 = (long)((local_180.super_BaseFab<double>.domain.bigend.vect[2] -
                            local_180.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
            lVar44 = (long)local_2d0.smallend.vect[1];
            lVar48 = (long)((local_180.super_BaseFab<double>.domain.bigend.vect[0] -
                            local_180.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
            lVar45 = (long)local_2d0.smallend.vect[0];
            local_528 = (lVar44 * 8 + (local_538 - local_270) * lVar46 * 8 + local_268 * -8) *
                        lVar48 + lVar45 * 8 + local_260 * -8 +
                        (long)local_180.super_BaseFab<double>.dptr;
            lVar52 = lVar46 * lVar48 * 8;
            lVar50 = lVar48 * 8;
            local_4f8 = ((lVar37 * 8 + local_538 * 8 + local_270 * -8) * lVar46 + lVar44 * 8 +
                        local_268 * -8) * lVar48 + lVar45 * 8 + local_260 * -8 +
                        (long)local_180.super_BaseFab<double>.dptr;
            local_4a0 = ((lVar37 * 0x10 + local_538 * 8 + local_270 * -8) * lVar46 + lVar44 * 8 +
                        local_268 * -8) * lVar48 + lVar45 * 8 + local_260 * -8 +
                        (long)local_180.super_BaseFab<double>.dptr;
            local_4a8 = ((local_538 * 8 + lVar37 * 0x18 + local_270 * -8) * lVar46 + lVar44 * 8 +
                        local_268 * -8) * lVar48 + lVar45 * 8 + local_260 * -8 +
                        (long)local_180.super_BaseFab<double>.dptr;
            local_4b0 = ((lVar37 * 0x20 + local_538 * 8 + local_270 * -8) * lVar46 + lVar44 * 8 +
                        local_268 * -8) * lVar48 + lVar45 * 8 + local_260 * -8 +
                        (long)local_180.super_BaseFab<double>.dptr;
            local_4b8 = ((local_538 * 8 + lVar37 * 0x28 + local_270 * -8) * lVar46 + lVar44 * 8 +
                        local_268 * -8) * lVar48 + lVar45 * 8 + local_260 * -8 +
                        (long)local_180.super_BaseFab<double>.dptr;
            local_4c0 = ((lVar37 * 0x30 + local_538 * 8 + local_270 * -8) * lVar46 + lVar44 * 8 +
                        local_268 * -8) * lVar48 + lVar45 * 8 + local_260 * -8 +
                        (long)local_180.super_BaseFab<double>.dptr;
            local_4c8 = ((lVar37 * 0x38 + local_538 * 8 + local_270 * -8) * lVar46 + lVar44 * 8 +
                        local_268 * -8) * lVar48 + lVar45 * 8 + local_260 * -8 +
                        (long)local_180.super_BaseFab<double>.dptr;
            local_4d0 = ((lVar37 * 0x40 + local_538 * 8 + local_270 * -8) * lVar46 + lVar44 * 8 +
                        local_268 * -8) * lVar48 + lVar45 * 8 + local_260 * -8 +
                        (long)local_180.super_BaseFab<double>.dptr;
            iVar42 = local_2d0.smallend.vect[2] + -1;
            do {
              if (local_2d0.smallend.vect[1] <= local_2d0.bigend.vect[1]) {
                lVar60 = (long)local_328.begin.x;
                lVar48 = (long)(iVar42 - local_328.begin.z) * local_328.kstride * 8;
                lVar55 = local_328.nstride * 0x10;
                lVar54 = local_328.kstride * 8 * (local_538 - local_328.begin.z);
                lVar37 = local_328.jstride * 8;
                lVar59 = (lVar44 - local_328.begin.y) * lVar37;
                lVar46 = lVar48 + lVar59;
                lVar59 = lVar59 + lVar54;
                lVar62 = lVar48 + lVar55 + lVar60 * -8 + lVar45 * 8;
                lVar61 = lVar48 + local_328.nstride * 8 + lVar60 * -8 + lVar45 * 8;
                lVar65 = lVar48 + lVar60 * -8 + lVar45 * 8;
                lVar57 = lVar54 + lVar55 + lVar60 * -8 + lVar45 * 8;
                lVar51 = lVar54 + local_328.nstride * 8 + lVar60 * -8 + lVar45 * 8;
                lVar53 = lVar54 + lVar60 * -8 + lVar45 * 8;
                lVar47 = (long)local_328.p + lVar46 + lVar55 + lVar60 * -8 + lVar45 * 8 + 8;
                lVar48 = (long)local_328.p +
                         lVar46 + local_328.nstride * 8 + lVar60 * -8 + 8 + lVar45 * 8;
                lVar46 = (long)local_328.p + lVar46 + lVar60 * -8 + 8 + lVar45 * 8;
                lVar54 = (long)local_328.p + lVar55 + lVar59 + lVar60 * -8 + 8 + lVar45 * 8;
                lVar55 = (long)local_328.p +
                         lVar59 + local_328.nstride * 8 + lVar60 * -8 + 8 + lVar45 * 8;
                lVar66 = (long)local_328.p + lVar59 + lVar60 * -8 + lVar45 * 8 + 8;
                iVar43 = (local_2d0.smallend.vect[1] + 1) - local_328.begin.y;
                iVar35 = (local_2d0.smallend.vect[1] + -1) - local_328.begin.y;
                local_518 = local_4a0;
                local_510 = local_4f8;
                lVar56 = local_4d0;
                lVar58 = local_4c8;
                lVar63 = local_4c0;
                lVar68 = local_4b8;
                lVar59 = local_528;
                lVar60 = local_4a8;
                lVar41 = local_4b0;
                local_488 = lVar44;
                do {
                  if (local_2d0.smallend.vect[0] <= local_2d0.bigend.vect[0]) {
                    lVar70 = iVar43 * lVar37;
                    lVar64 = iVar35 * lVar37;
                    lVar67 = (local_488 - local_328.begin.y) * local_328.jstride;
                    lVar69 = 0;
                    do {
                      lVar49 = (long)(((local_2d0.smallend.vect[0] + -1) - local_328.begin.x) +
                                     (int)lVar69);
                      pdVar1 = local_328.p +
                               lVar67 + lVar49 + local_328.kstride * (local_538 - local_328.begin.z)
                      ;
                      dVar6 = *(double *)(lVar55 + lVar69 * 8);
                      dVar7 = *(double *)(lVar48 + lVar69 * 8);
                      dVar8 = pdVar1[local_328.nstride];
                      dVar9 = *(double *)(lVar54 + lVar69 * 8);
                      dVar10 = *(double *)(lVar47 + lVar69 * 8);
                      dVar11 = pdVar1[local_328.nstride * 2];
                      pdVar2 = local_328.p +
                               lVar67 + lVar49 + (~local_328.begin.z + (int)local_538) *
                                                 local_328.kstride;
                      dVar12 = pdVar2[local_328.nstride];
                      dVar13 = pdVar2[local_328.nstride * 2];
                      dVar14 = *(double *)(lVar66 + -8 + lVar69 * 8);
                      dVar15 = *(double *)(lVar55 + -8 + lVar69 * 8);
                      dVar16 = *(double *)(lVar54 + -8 + lVar69 * 8);
                      dVar17 = *(double *)((long)local_328.p + lVar69 * 8 + lVar70 + lVar53);
                      dVar18 = *(double *)((long)local_328.p + lVar69 * 8 + lVar70 + lVar65);
                      dVar19 = *(double *)((long)local_328.p + lVar69 * 8 + lVar64 + lVar53);
                      dVar20 = *(double *)((long)local_328.p + lVar69 * 8 + lVar64 + lVar65);
                      dVar21 = *(double *)((long)local_328.p + lVar69 * 8 + lVar70 + lVar51);
                      dVar22 = *(double *)((long)local_328.p + lVar69 * 8 + lVar70 + lVar61);
                      dVar23 = *(double *)((long)local_328.p + lVar69 * 8 + lVar64 + lVar51);
                      dVar24 = *(double *)((long)local_328.p + lVar69 * 8 + lVar64 + lVar61);
                      dVar25 = *(double *)((long)local_328.p + lVar69 * 8 + lVar70 + lVar57);
                      dVar26 = *(double *)((long)local_328.p + lVar69 * 8 + lVar70 + lVar62);
                      dVar27 = *(double *)((long)local_328.p + lVar69 * 8 + lVar64 + lVar57);
                      dVar28 = *(double *)((long)local_328.p + lVar69 * 8 + lVar64 + lVar62);
                      dVar29 = *(double *)(lVar46 + -8 + lVar69 * 8);
                      dVar30 = *(double *)(lVar48 + -8 + lVar69 * 8);
                      dVar31 = *(double *)(lVar47 + -8 + lVar69 * 8);
                      *(double *)(lVar59 + lVar69 * 8) =
                           (((*(double *)(lVar66 + lVar69 * 8) + *(double *)(lVar46 + lVar69 * 8)) -
                            *pdVar1) - *pdVar2) * local_288;
                      *(double *)(local_510 + lVar69 * 8) =
                           (((dVar6 + dVar7) - dVar8) - dVar12) * local_288;
                      *(double *)(local_518 + lVar69 * 8) =
                           (((dVar9 + dVar10) - dVar11) - dVar13) * local_288;
                      *(double *)(lVar60 + lVar69 * 8) =
                           (((dVar17 + dVar18) - dVar19) - dVar20) * local_290;
                      *(double *)(lVar41 + lVar69 * 8) =
                           (((dVar21 + dVar22) - dVar23) - dVar24) * local_290;
                      *(double *)(lVar68 + lVar69 * 8) =
                           (((dVar25 + dVar26) - dVar27) - dVar28) * local_290;
                      *(double *)(lVar63 + lVar69 * 8) = (dVar14 - dVar29) * dVar5;
                      *(double *)(lVar58 + lVar69 * 8) = (dVar15 - dVar30) * dVar5;
                      *(double *)(lVar56 + lVar69 * 8) = (dVar16 - dVar31) * dVar5;
                      lVar69 = lVar69 + 1;
                    } while ((local_2d0.bigend.vect[0] - local_2d0.smallend.vect[0]) + 1 !=
                             (int)lVar69);
                  }
                  local_488 = local_488 + 1;
                  iVar43 = iVar43 + 1;
                  iVar35 = iVar35 + 1;
                  lVar47 = lVar47 + lVar37;
                  lVar48 = lVar48 + lVar37;
                  lVar46 = lVar46 + lVar37;
                  lVar54 = lVar54 + lVar37;
                  lVar55 = lVar55 + lVar37;
                  lVar66 = lVar66 + lVar37;
                  lVar59 = lVar59 + lVar50;
                  local_510 = local_510 + lVar50;
                  local_518 = local_518 + lVar50;
                  lVar60 = lVar60 + lVar50;
                  lVar41 = lVar41 + lVar50;
                  lVar68 = lVar68 + lVar50;
                  lVar63 = lVar63 + lVar50;
                  lVar58 = lVar58 + lVar50;
                  lVar56 = lVar56 + lVar50;
                } while (local_2d0.bigend.vect[1] + 1 != (int)local_488);
              }
              local_538 = local_538 + 1;
              iVar42 = iVar42 + 1;
              local_528 = local_528 + lVar52;
              local_4f8 = local_4f8 + lVar52;
              local_4a0 = local_4a0 + lVar52;
              local_4a8 = local_4a8 + lVar52;
              local_4b0 = local_4b0 + lVar52;
              local_4b8 = local_4b8 + lVar52;
              local_4c0 = local_4c0 + lVar52;
              local_4c8 = local_4c8 + lVar52;
              local_4d0 = local_4d0 + lVar52;
            } while (local_2d0.bigend.vect[2] + 1 != (int)local_538);
          }
          lVar50 = 0;
          do {
            MFIter::nodaltilebox(&local_248,&local_138,(int)lVar50);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_d8,&local_250->_M_elems[lVar50]->super_FabArray<amrex::FArrayBox>,
                       &local_138);
            iVar42 = (&local_210)[lVar50].domain.smallend.vect[0];
            iVar43 = (&local_210)[lVar50].domain.smallend.vect[1];
            iVar35 = (&local_210)[lVar50].domain.smallend.vect[2];
            iVar36 = (&local_1c8)[lVar50 + -1].super_BaseFab<double>.domain.bigend.vect[2];
            lVar37 = (long)(((&local_210)[lVar50].domain.bigend.vect[0] - iVar42) + 1);
            lVar44 = (long)(((&local_1c8)[lVar50 + -1].super_BaseFab<double>.domain.bigend.vect[1] -
                            iVar43) + 1);
            lVar48 = (long)local_248.smallend.vect[1];
            lVar45 = (lVar48 * 8 + ((long)local_248.smallend.vect[2] - (long)iVar35) * lVar44 * 8 +
                     (long)iVar43 * -8) * lVar37 + (long)local_248.smallend.vect[0] * 8 +
                     (long)iVar42 * -8 + (long)(&local_210)[lVar50].dptr;
            lVar46 = lVar44 * lVar37 * 8;
            local_550 = 0;
            lVar44 = 0;
            do {
              lVar52 = lVar45;
              lVar54 = (long)local_248.smallend.vect[2];
              if (local_248.smallend.vect[2] <= local_248.bigend.vect[2]) {
                do {
                  if (local_248.smallend.vect[1] <= local_248.bigend.vect[1]) {
                    lVar60 = (long)local_d8.p +
                             local_d8.nstride * local_550 +
                             (lVar48 - local_d8.begin.y) * local_d8.jstride * 8 +
                             (lVar54 - local_d8.begin.z) * local_d8.kstride * 8 +
                             (long)local_d8.begin.x * -8 + (long)local_248.smallend.vect[0] * 8;
                    lVar55 = lVar48;
                    lVar59 = lVar52;
                    do {
                      if (local_248.smallend.vect[0] <= local_248.bigend.vect[0]) {
                        lVar62 = 0;
                        do {
                          *(undefined8 *)(lVar60 + lVar62 * 8) =
                               *(undefined8 *)(lVar59 + lVar62 * 8);
                          lVar62 = lVar62 + 1;
                        } while ((local_248.bigend.vect[0] - local_248.smallend.vect[0]) + 1 !=
                                 (int)lVar62);
                      }
                      lVar55 = lVar55 + 1;
                      lVar60 = lVar60 + local_d8.jstride * 8;
                      lVar59 = lVar59 + lVar37 * 8;
                    } while (local_248.bigend.vect[1] + 1 != (int)lVar55);
                  }
                  lVar54 = lVar54 + 1;
                  lVar52 = lVar52 + lVar46;
                } while (local_248.bigend.vect[2] + 1 != (int)lVar54);
              }
              lVar44 = lVar44 + 1;
              local_550 = local_550 + 8;
              lVar45 = lVar45 + ((iVar36 - iVar35) + 1) * lVar46;
            } while (lVar44 != 9);
            lVar50 = lVar50 + 1;
          } while (lVar50 != 3);
          Gpu::Elixir::~Elixir(&local_98);
          Gpu::Elixir::~Elixir(&local_80);
          Gpu::Elixir::~Elixir(&local_68);
          pFVar38 = local_280;
        }
        else {
          Abort_host("compVelGrad not yet implemented for cut-cells  ");
        }
      }
      MFIter::operator++(&local_138);
    } while (local_138.currentIndex < local_138.endIndex);
  }
  MFIter::~MFIter(&local_138);
  lVar50 = 0x90;
  do {
    this_00 = (BaseFab<double> *)((long)(&local_210.domain.smallend + -2) + lVar50);
    this_00->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
    BaseFab<double>::clear(this_00);
    lVar50 = lVar50 + -0x48;
  } while (lVar50 != -0x48);
  return;
}

Assistant:

void
MLEBTensorOp::compVelGrad (int amrlev, const Array<MultiFab*,AMREX_SPACEDIM>& fluxes,
                       MultiFab& sol, Location loc) const
{
    BL_PROFILE("MLEBTensorOp::compVelGrad()");

    if ( !(loc==Location::FaceCenter || loc==Location::FaceCentroid) )
      amrex::Abort("MLEBTensorOp::compVelGrad() unknown location for VelGradients.");

    const int mglev = 0;

    applyBCTensor(amrlev, mglev, sol, BCMode::Inhomogeneous, StateMode::Solution, m_bndry_sol[amrlev].get());

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    const int dim_fluxes = AMREX_SPACEDIM*AMREX_SPACEDIM;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  {
    Array<FArrayBox,AMREX_SPACEDIM> fluxfab_tmp;
    for (MFIter mfi(sol, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (fabtyp == FabType::covered) continue;

        if (fabtyp == FabType::regular)
        {

            Array4<Real const> const vfab = sol.const_array(mfi);
            AMREX_D_TERM(Box const xbx = mfi.nodaltilebox(0);,
                         Box const ybx = mfi.nodaltilebox(1);,
                         Box const zbx = mfi.nodaltilebox(2););
            AMREX_D_TERM(fluxfab_tmp[0].resize(xbx,dim_fluxes);,
                         fluxfab_tmp[1].resize(ybx,dim_fluxes);,
                         fluxfab_tmp[2].resize(zbx,dim_fluxes););
            AMREX_D_TERM(Elixir fxeli = fluxfab_tmp[0].elixir();,
                         Elixir fyeli = fluxfab_tmp[1].elixir();,
                         Elixir fzeli = fluxfab_tmp[2].elixir(););
            AMREX_D_TERM(Array4<Real> const fxfab = fluxfab_tmp[0].array();,
                         Array4<Real> const fyfab = fluxfab_tmp[1].array();,
                         Array4<Real> const fzfab = fluxfab_tmp[2].array(););
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
            ( xbx, txbx,
              {
                  mltensor_vel_grads_fx(txbx,fxfab,vfab,dxinv);
              }
            , ybx, tybx,
              {
                  mltensor_vel_grads_fy(tybx,fyfab,vfab,dxinv);
              }
            , zbx, tzbx,
              {
                  mltensor_vel_grads_fz(tzbx,fzfab,vfab,dxinv);
              }
            );

// The derivatives are put in the array with the following order:
// component: 0    ,  1    ,  2    ,  3    ,  4    , 5    ,  6    ,  7    ,  8
// in 2D:     dU/dx,  dV/dx,  dU/dy,  dV/dy
// in 3D:     dU/dx,  dV/dx,  dW/dx,  dU/dy,  dV/dy, dW/dy,  dU/dz,  dV/dz,  dW/dz


            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                const Box& nbx = mfi.nodaltilebox(idim);
                Array4<Real      > dst = fluxes[idim]->array(mfi);
                Array4<Real const> src = fluxfab_tmp[idim].const_array();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D (nbx, dim_fluxes, i, j, k, n,
                {
                    dst(i,j,k,n) = src(i,j,k,n);
                });
            }


        }
        else if ( loc==Location::FaceCenter )
        {

          amrex::Abort("compVelGrad not yet implemented for cut-cells  ");

        }
        else // loc==Location::FaceCentroid
        {

          amrex::Abort("compVelGrad not yet implemented for cut-cells  ");

        }

    }
  }
}